

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_>::check_done
          (basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  char_type *pcVar1;
  char_type *pcVar2;
  char_type *pcVar3;
  span<const_char,_18446744073709551615UL> sVar4;
  
  if ((this->source_).source_.current_ == (this->source_).source_.end_) {
    basic_json_parser<char,_std::allocator<char>_>::check_done(&this->parser_,ec);
    return;
  }
  pcVar1 = (this->parser_).input_ptr_;
  pcVar3 = (this->parser_).end_input_;
  do {
    pcVar2 = pcVar3;
    if (pcVar1 == pcVar2) {
      sVar4 = json_source_adaptor<jsoncons::string_source<char>_>::read_buffer(&this->source_,ec);
      pcVar1 = sVar4.data_;
      if (ec->_M_value != 0) {
        return;
      }
      if (sVar4.size_ == 0) {
        pcVar2 = (this->parser_).end_input_;
        pcVar1 = (this->parser_).input_ptr_;
      }
      else {
        (this->parser_).begin_input_ = pcVar1;
        pcVar2 = pcVar1 + sVar4.size_;
        (this->parser_).end_input_ = pcVar2;
        (this->parser_).input_ptr_ = pcVar1;
      }
    }
    pcVar3 = pcVar2;
    if (pcVar1 != pcVar2) {
      basic_json_parser<char,_std::allocator<char>_>::check_done(&this->parser_,ec);
      if (ec->_M_value != 0) {
        return;
      }
      pcVar3 = (this->parser_).end_input_;
      pcVar2 = (this->parser_).input_ptr_;
    }
    pcVar1 = pcVar2;
  } while ((pcVar2 != pcVar3) || ((this->source_).source_.current_ != (this->source_).source_.end_))
  ;
  return;
}

Assistant:

void check_done(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }   
            if (source_.eof())
            {
                parser_.check_done(ec);
                if (JSONCONS_UNLIKELY(ec)) return;
            }
            else
            {
                do
                {
                    if (parser_.source_exhausted())
                    {
                        auto s = source_.read_buffer(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                        if (s.size() > 0)
                        {
                            parser_.update(s.data(),s.size());
                        }
                    }
                    if (!parser_.source_exhausted())
                    {
                        parser_.check_done(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                    }
                }
                while (!eof());
            }
        }